

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt slang::SVInt::fromDecimalDigits
                (bitwidth_t bits,bool isSigned,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar11;
  invalid_argument *piVar12;
  long lVar13;
  long lVar14;
  undefined7 in_register_00000031;
  ulong uVar15;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  ulong in_R8;
  ulong uVar16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar21;
  bool bVar22;
  bool bVar23;
  SVIntStorage SVar24;
  SVInt SVar25;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string sStack_78;
  ulong local_58 [2];
  undefined8 local_48;
  
  this.val._4_4_ = in_register_0000003c;
  this.val._0_4_ = bits;
  aVar21.val = digits.size_;
  uVar18 = 0;
  SVar24 = (SVIntStorage)
           allocZeroed((SVInt *)this.pVal,(bitwidth_t)CONCAT71(in_register_00000031,isSigned),
                       digits.data_._0_1_,false);
  uVar15 = 0x12;
  if (0x12 < in_R8) {
    puVar2 = (ulong *)*this.pVal;
    uVar18 = 0;
    aVar11.val = aVar21.val;
    do {
      uVar19 = (ulong)(byte)*aVar11.pVal;
      if (9 < uVar19) {
        piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_48 = 10;
        fmt_01.size_ = 0x12;
        fmt_01.data_ = (char *)0x1f;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_58;
        local_58[0] = uVar19;
        ::fmt::v9::vformat_abi_cxx11_
                  (&sStack_78,(v9 *)"Digit {} too large for radix {}",fmt_01,args_01);
        std::invalid_argument::invalid_argument(piVar12,(string *)&sStack_78);
        __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      aVar21.pVal = (uint64_t *)(aVar11.val + 0x12);
      lVar13 = 1;
      do {
        uVar20 = (ulong)*(byte *)((long)aVar11.pVal + lVar13);
        if (9 < uVar20) {
          piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_48 = 10;
          fmt.size_ = 0x12;
          fmt.data_ = (char *)0x1f;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)local_58;
          local_58[0] = uVar20;
          ::fmt::v9::vformat_abi_cxx11_(&sStack_78,(v9 *)"Digit {} too large for radix {}",fmt,args)
          ;
          std::invalid_argument::invalid_argument(piVar12,(string *)&sStack_78);
          __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        uVar19 = uVar19 * 10 + uVar20;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x12);
      if (uVar18 == 0) {
        lVar13 = 0x12;
        if (uVar19 == 0) {
          uVar18 = 0;
        }
        else {
          *puVar2 = uVar19;
          uVar18 = 1;
        }
      }
      else {
        uVar20 = (ulong)uVar18;
        uVar17 = 0;
        in_R9.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = in_R9;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = puVar2[uVar17];
          auVar9 = ZEXT816(1000000000000000000) * auVar7 + auVar9;
          in_R9 = auVar9._8_8_;
          puVar2[uVar17] = auVar9._0_8_;
          uVar17 = uVar17 + 1;
        } while (uVar20 != uVar17);
        bVar22 = false;
        lVar14 = 0;
        do {
          puVar1 = puVar2 + lVar14;
          uVar16 = (ulong)bVar22;
          uVar17 = *puVar1;
          uVar4 = *puVar1 + uVar19;
          bVar22 = CARRY8(uVar17,uVar19) || CARRY8(uVar4,uVar16);
          *puVar1 = uVar4 + uVar16;
          lVar13 = lVar14;
          if (!CARRY8(uVar17,uVar19) && !CARRY8(uVar4,uVar16)) break;
          lVar13 = lVar14 + 1;
          bVar23 = uVar20 - 1 != lVar14;
          lVar14 = lVar13;
        } while (bVar23);
        aVar11.pVal = (uint64_t *)((long)&(in_R9.values_)->field_0 + (ulong)bVar22);
        if ((byte *)aVar11.val != (byte *)0x0) {
          uVar18 = uVar18 + 1;
          ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(puVar2 + uVar20))->pVal =
               (uint64_t *)aVar11;
        }
      }
      SVar24.bitWidth = (int)lVar13;
      SVar24.signFlag = (bool)(char)((ulong)lVar13 >> 0x20);
      SVar24.unknownFlag = (bool)(char)((ulong)lVar13 >> 0x28);
      SVar24._14_2_ = (short)((ulong)lVar13 >> 0x30);
      SVar24.field_0.val = aVar11.val;
      uVar15 = uVar15 + 0x12;
      aVar11.pVal = aVar21.pVal;
    } while (uVar15 < in_R8);
  }
  uVar19 = SVar24._8_8_;
  uVar20 = (ulong)(byte)*aVar21.pVal;
  if (9 < uVar20) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_48 = 10;
    fmt_02.size_ = 0x12;
    fmt_02.data_ = (char *)0x1f;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)local_58;
    local_58[0] = uVar20;
    ::fmt::v9::vformat_abi_cxx11_(&sStack_78,(v9 *)"Digit {} too large for radix {}",fmt_02,args_02)
    ;
    std::invalid_argument::invalid_argument(piVar12,(string *)&sStack_78);
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar17 = 10;
  if (in_R8 - uVar15 != -0x11) {
    lVar13 = 0;
    do {
      uVar16 = (ulong)((byte *)(aVar21.val + 1))[lVar13];
      if (9 < uVar16) {
        piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_48 = 10;
        fmt_00.size_ = 0x12;
        fmt_00.data_ = (char *)0x1f;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_58;
        local_58[0] = uVar16;
        ::fmt::v9::vformat_abi_cxx11_
                  (&sStack_78,(v9 *)"Digit {} too large for radix {}",fmt_00,args_00);
        std::invalid_argument::invalid_argument(piVar12,(string *)&sStack_78);
        __cxa_throw(piVar12,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar19 = uVar20 * 5;
      uVar20 = uVar20 * 10 + uVar16;
      uVar17 = uVar17 * 10;
      lVar13 = lVar13 + 1;
    } while ((in_R8 - uVar15) + 0x11 != lVar13);
  }
  if (uVar18 == 0) {
    if (uVar20 != 0) {
      *(ulong *)*this.pVal = uVar20;
    }
  }
  else {
    uVar3 = *this.pVal;
    uVar15 = (ulong)uVar18;
    uVar19 = 0;
    uVar16 = 0;
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar16;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar17;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(uVar3 + uVar19 * 8);
      auVar10 = auVar6 * auVar8 + auVar10;
      uVar16 = auVar10._8_8_;
      *(long *)(uVar3 + uVar19 * 8) = auVar10._0_8_;
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
    uVar19 = 0;
    lVar13 = 0;
    do {
      puVar2 = (ulong *)(uVar3 + lVar13 * 8);
      uVar4 = (ulong)((char)uVar19 != '\0');
      uVar17 = *puVar2;
      uVar5 = *puVar2 + uVar20;
      bVar22 = CARRY8(uVar17,uVar20) || CARRY8(uVar5,uVar4);
      *puVar2 = uVar5 + uVar4;
      uVar19 = (ulong)bVar22;
      if (!CARRY8(uVar17,uVar20) && !CARRY8(uVar5,uVar4)) break;
      bVar23 = uVar15 - 1 != lVar13;
      lVar13 = lVar13 + 1;
    } while (bVar23);
    lVar13 = bVar22 + uVar16;
    if (lVar13 != 0) {
      *(long *)(uVar3 + uVar15 * 8) = lVar13;
    }
  }
  SVar25.super_SVIntStorage.bitWidth = (int)uVar19;
  SVar25.super_SVIntStorage.signFlag = (bool)(char)(uVar19 >> 0x20);
  SVar25.super_SVIntStorage.unknownFlag = (bool)(char)(uVar19 >> 0x28);
  SVar25.super_SVIntStorage._14_2_ = (short)(uVar19 >> 0x30);
  SVar25.super_SVIntStorage.field_0.val = this.val;
  return (SVInt)SVar25.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDecimalDigits(bitwidth_t bits, bool isSigned, span<logic_t const> digits) {
    SVInt result = allocZeroed(bits, isSigned, false);

    constexpr int charsPerWord = 18; // 18 decimal digits can fit in a 64-bit word
    const logic_t* d = digits.data();
    uint64_t maxWord = (uint64_t)std::pow(10, charsPerWord);
    uint32_t count = 0;
    uint64_t word;

    auto nextDigit = [&]() {
        uint8_t v = d->value;
        if (v >= 10) {
            throw std::invalid_argument(fmt::format("Digit {} too large for radix {}", v, 10));
        }
        d++;
        return v;
    };

    auto writeWord = [&]() {
        if (!count) {
            if (word)
                result.pVal[count++] = word;
        }
        else {
            uint64_t carry = mulOne(result.pVal, result.pVal, count, maxWord);
            carry += addOne(result.pVal, result.pVal, count, word);
            if (carry)
                result.pVal[count++] = carry;
        }
    };

    size_t i;
    for (i = charsPerWord; i < digits.size(); i += charsPerWord) {
        word = nextDigit();
        for (size_t j = charsPerWord - 1; j != 0; j--)
            word = word * 10 + nextDigit();

        writeWord();
    }

    maxWord = 10;
    word = nextDigit();

    for (size_t j = digits.size() - (i - charsPerWord) - 1; j > 0; j--) {
        word = word * 10 + nextDigit();
        maxWord *= 10;
    }

    writeWord();

    return result;
}